

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O1

void BM_Check2(int n)

{
  uint uVar1;
  ostream *poVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  LogMessage LStack_68;
  
  if (n == 0x11) {
    x = 1;
  }
  uVar3 = (x & 1) - 1 | 5;
  uVar1 = ~(n >> 0x1f) & n;
  if (n <= (int)uVar3) {
    uVar3 = n;
  }
  uVar3 = n - uVar3;
  uVar4 = uVar1;
  if (uVar3 < uVar1) {
    uVar4 = uVar3;
  }
  do {
    if (uVar1 <= uVar3) {
      return;
    }
    bVar5 = uVar3 == uVar4;
    if (bVar5) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_68,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x9e);
      poVar2 = google::LogMessage::stream(&LStack_68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Check failed: n >= x ",0x15);
      goto LAB_0010abbb;
    }
    if (bVar5) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_68,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x9f);
      poVar2 = google::LogMessage::stream(&LStack_68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Check failed: n >= x ",0x15);
      goto LAB_0010abbb;
    }
    if (bVar5) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_68,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0xa0);
      poVar2 = google::LogMessage::stream(&LStack_68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Check failed: n >= x ",0x15);
      goto LAB_0010abbb;
    }
    if (bVar5) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_68,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0xa1);
      poVar2 = google::LogMessage::stream(&LStack_68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Check failed: n >= x ",0x15);
      goto LAB_0010abbb;
    }
    if (bVar5) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_68,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0xa2);
      poVar2 = google::LogMessage::stream(&LStack_68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Check failed: n >= x ",0x15);
      goto LAB_0010abbb;
    }
    if (bVar5) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_68,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0xa3);
      poVar2 = google::LogMessage::stream(&LStack_68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Check failed: n >= x ",0x15);
      goto LAB_0010abbb;
    }
    if (bVar5) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_68,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0xa4);
      poVar2 = google::LogMessage::stream(&LStack_68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Check failed: n >= x ",0x15);
      goto LAB_0010abbb;
    }
  } while (!bVar5);
  google::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0xa5);
  poVar2 = google::LogMessage::stream(&LStack_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Check failed: n >= x ",0x15);
LAB_0010abbb:
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_68);
}

Assistant:

static void BM_Check2(int n) {
  if (n == 17) {
    x = 5;
  }
  while (n-- > 0) {
    CHECK(n >= x);
    CHECK(n >= x);
    CHECK(n >= x);
    CHECK(n >= x);
    CHECK(n >= x);
    CHECK(n >= x);
    CHECK(n >= x);
    CHECK(n >= x);
  }
}